

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O2

void __thiscall
ExampleNLFeeder::
FeedColumnSizes<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,ExampleNLFeeder>>::ColSizeWriter>
          (ExampleNLFeeder *this,ColSizeWriter *csw)

{
  mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::ColSizeWriter::Write
            (csw,this->mdl_->col_sizes[0]);
  return;
}

Assistant:

void FeedColumnSizes(ColSizeWriter& csw) {
    if (WantColumnSizes())
      for (int i=0; i < Model().n_var-1; ++i)
        csw.Write(Model().col_sizes[i]);
  }